

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

void __thiscall psy::C::Parser::parsePredefinedName_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  SyntaxToken *pSVar1;
  PredefinedNameSyntax *pPVar2;
  IndexType IVar3;
  ostream *poVar4;
  SyntaxToken local_58;
  
  pSVar1 = peek(this,1);
  local_58.tree_ = pSVar1->tree_;
  local_58.syntaxK_ = pSVar1->syntaxK_;
  local_58.byteSize_ = pSVar1->byteSize_;
  local_58.charSize_ = pSVar1->charSize_;
  local_58._14_2_ = *(undefined2 *)&pSVar1->field_0xe;
  local_58.byteOffset_ = pSVar1->byteOffset_;
  local_58.charOffset_ = pSVar1->charOffset_;
  local_58.matchingBracket_ = pSVar1->matchingBracket_;
  local_58.field_7 = pSVar1->field_7;
  local_58._34_2_ = *(undefined2 *)&pSVar1->field_0x22;
  local_58.lineno_ = pSVar1->lineno_;
  local_58.column_ = pSVar1->column_;
  local_58._44_4_ = *(undefined4 *)&pSVar1->field_0x2c;
  local_58.field_10 = pSVar1->field_10;
  if ((local_58.syntaxK_ - 0x69 < 0x25) &&
     ((0x1e30000001U >> ((ulong)(local_58.syntaxK_ - 0x69) & 0x3f) & 1) != 0)) {
    SyntaxToken::~SyntaxToken(&local_58);
    pPVar2 = makeNode<psy::C::PredefinedNameSyntax>(this);
    *expr = (ExpressionSyntax *)pPVar2;
    IVar3 = consume(this);
    pPVar2->identTkIdx_ = IVar3;
  }
  else {
    SyntaxToken::~SyntaxToken(&local_58);
    poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6d);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"assert failure: <predefined-name>");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return;
}

Assistant:

void Parser::parsePredefinedName_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(SyntaxFacts::isPredefinedSyntax(peek()),
                  return,
                  "assert failure: <predefined-name>");

    auto predefExpr = makeNode<PredefinedNameSyntax>();
    expr = predefExpr;
    predefExpr->identTkIdx_ = consume();
}